

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GrcSymTable.cpp
# Opt level: O1

int __thiscall GrcSymbolTableEntry::FieldIndex(GrcSymbolTableEntry *this,string *sta)

{
  size_t sVar1;
  size_t __n;
  int iVar2;
  int iVar3;
  
  sVar1 = sta->_M_string_length;
  iVar3 = -1;
  do {
    __n = (this->m_staFieldName)._M_string_length;
    if (__n == sVar1) {
      if (__n != 0) {
        iVar2 = bcmp((this->m_staFieldName)._M_dataplus._M_p,(sta->_M_dataplus)._M_p,__n);
        if (iVar2 != 0) goto LAB_0016dffa;
      }
      iVar3 = this->m_psymtbl->m_cLevel;
    }
LAB_0016dffa:
    this = this->m_psymtbl->m_psymParent;
    if (this == (Symbol)0x0) {
      return iVar3;
    }
  } while( true );
}

Assistant:

int GrcSymbolTableEntry::FieldIndex(std::string sta)
{
	int cRet = -1;
	Symbol psymCurr = this;
	while (psymCurr)
	{
		if (psymCurr->m_staFieldName == sta)
			cRet = psymCurr->Level();
		psymCurr = psymCurr->m_psymtbl->m_psymParent;
	}
	return cRet;
}